

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

double __thiscall
anon_unknown.dwarf_8c6fd8::ProbModelXMLTransitionProbFunctor::operator()
          (ProbModelXMLTransitionProbFunctor *this,Index y,Index yVal,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Xs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *As,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Ys)

{
  double dVar1;
  ParserProbModelXML *in_stack_00000360;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000368;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000370;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000378;
  Index in_stack_00000380;
  Index in_stack_00000384;
  FactoredDecPOMDPDiscrete *in_stack_00000390;
  
  dVar1 = ComputeTransitionProb
                    (in_stack_00000384,in_stack_00000380,in_stack_00000378,in_stack_00000370,
                     in_stack_00000368,in_stack_00000360,in_stack_00000390);
  return dVar1;
}

Assistant:

double operator()(Index y, 
                    Index yVal,
                    const std::vector< Index>& Xs,
                    const std::vector< Index>& As,
                    const std::vector< Index>& Ys) const
  {return ComputeTransitionProb (y,yVal,Xs,As,Ys,_m_parser,_m_fDecPOMDP);}